

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::resetTols(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  element_type *this_00;
  long in_RDI;
  double in_stack_000000c0;
  cpp_dec_float<200U,_int,_void> *in_stack_000000c8;
  undefined1 local_38 [40];
  long local_10;
  undefined1 *local_8;
  
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_38);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x78bcaa);
  local_38._16_8_ = Tolerances::scaleAccordingToEpsilon(this_00,1e-10);
  local_10 = in_RDI + 0x130;
  local_38._32_8_ = local_38 + 0x10;
  local_8 = (undefined1 *)local_38._32_8_;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            (in_stack_000000c8,in_stack_000000c0);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x78bd05);
  return;
}

Assistant:

void SPxFastRT<R>::resetTols()
{
   epsilon = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_EPSILON);
}